

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void parser_eat_all_blanks(VrplibParser *p)

{
  char *pcVar1;
  char *at;
  
  do {
    pcVar1 = p->at;
    parser_eat_whitespaces(p);
    parser_eat_newline(p);
    parser_eat_whitespaces(p);
  } while (p->at != pcVar1);
  return;
}

Assistant:

static void parser_eat_all_blanks(VrplibParser *p) {
    char *at = NULL;
    do {
        at = p->at;
        parser_eat_whitespaces(p);
        parser_eat_newline(p);
        parser_eat_whitespaces(p);
    } while (p->at != at);
}